

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

void __thiscall Clasp::ClaspVmtf::endInit(ClaspVmtf *this,Solver *s)

{
  pointer pVVar1;
  uint32 uVar2;
  Var v;
  uint v_00;
  uint32 uVar3;
  pointer puVar4;
  _Iter_comp_iter<Clasp::ClaspVmtf::LessLevel> __comp;
  uint local_4c;
  VarVec vars;
  
  if (((this->types_).m & 1) == 0) {
    for (v_00 = 1; v_00 <= (s->assign_).assign_.ebo_.size - 1; v_00 = v_00 + 1) {
      if (((s->assign_).assign_.ebo_.buf[v_00] & 3) == 0) {
        VarInfo::activity((this->score_).ebo_.buf + v_00,this->decay_);
        pVVar1 = (this->score_).ebo_.buf;
        if (pVVar1[v_00].prev_ == pVVar1[v_00].next_) {
          addToList(this,v_00);
        }
      }
    }
  }
  else {
    uVar3 = this->decay_;
    vars.ebo_.buf = (pointer)0x0;
    vars.ebo_.size = 0;
    vars.ebo_.cap = 0;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&vars,(s->assign_).assign_.ebo_.size - this->nList_);
    uVar3 = uVar3 + 1;
    local_4c = 1;
    while( true ) {
      if ((s->assign_).assign_.ebo_.size - 1 < local_4c) break;
      if (((s->assign_).assign_.ebo_.buf[local_4c] & 3) == 0) {
        VarInfo::activity((this->score_).ebo_.buf + local_4c,this->decay_);
        pVVar1 = (this->score_).ebo_.buf;
        if (pVVar1[local_4c].prev_ == pVVar1[local_4c].next_) {
          uVar2 = momsScore(s,local_4c);
          pVVar1 = (this->score_).ebo_.buf;
          pVVar1[local_4c].activity_ = uVar2;
          pVVar1[local_4c].decay_ = uVar3;
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&vars,&local_4c);
        }
      }
      local_4c = local_4c + 1;
    }
    __comp._M_comp.sc_ = &this->score_;
    __comp._M_comp.s_ = s;
    std::__stable_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::ClaspVmtf::LessLevel>>
              (vars.ebo_.buf,vars.ebo_.buf + (vars.ebo_._8_8_ & 0xffffffff),__comp);
    for (puVar4 = vars.ebo_.buf; puVar4 != vars.ebo_.buf + (vars.ebo_._8_8_ & 0xffffffff);
        puVar4 = puVar4 + 1) {
      addToList(this,*puVar4);
      pVVar1 = (this->score_).ebo_.buf;
      if (pVVar1[*puVar4].decay_ == uVar3) {
        pVVar1[*puVar4].activity_ = 0;
        pVVar1[*puVar4].decay_ = this->decay_;
      }
    }
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::ebo::~ebo(&vars.ebo_);
  }
  this->front_ = ((this->score_).ebo_.buf)->next_;
  return;
}

Assistant:

void ClaspVmtf::endInit(Solver& s) {
	bool moms = types_.inSet(Constraint_t::Static);
	if (!moms) {
		// - add all new vars
		for (Var v = 1; v <= s.numVars(); ++v) {
			if (s.value(v) == value_free) {
				score_[v].activity(decay_);
				if (!score_[v].inList()) {
					addToList(v);
				}
			}
		}
	}
	else {
		// - set activity of all vars not in list to moms
		// - append new vars in moms-activity order
		const uint32 momsStamp = decay_ + 1;
		const uint32 assumeNew = (s.numVars() + 1) - nList_;
		VarVec vars;
		vars.reserve(assumeNew);
		for (Var v = 1; v <= s.numVars(); ++v) {
			if (s.value(v) == value_free) {
				score_[v].activity(decay_);
				if (!score_[v].inList()) {
					score_[v].activity_ = momsScore(s, v);
					score_[v].decay_    = momsStamp;
					vars.push_back(v);
				}
			}
		}
		std::stable_sort(vars.begin(), vars.end(), LessLevel(s, score_));
		for (VarVec::iterator it = vars.begin(); it != vars.end(); ++it) {
			addToList(*it);
			if (score_[*it].decay_ == momsStamp) {
				score_[*it].activity_ = 0;
				score_[*it].decay_    = decay_;
			}
		}
	}
	front_ = getFront();
}